

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O2

string * format_error<int_const&>
                   (string *__return_storage_ptr__,Options *opt,char *type,TokenInfo *context,
                   char *msg,int *args)

{
  size_t offset;
  uint32_t lineno;
  optional<const_TokenStream::TextStream_&> *stream;
  pointer filename;
  uint32_t length;
  pair<unsigned_long,_unsigned_long> pVar1;
  uint32_t colno;
  optional<const_TokenStream::TextStream_&> local_40;
  optional<const_TokenStream::TextStream_&> local_38;
  
  offset = context->begin;
  if (context->end == offset) {
    stream = &local_38;
    local_38.ref = (TextStream *)0x0;
    filename = (context->stream->stream_name)._M_dataplus._M_p;
    length = 0;
    colno = 0;
    lineno = 0;
  }
  else {
    length = (int)context->end - (int)offset;
    pVar1 = TokenStream::TextStream::linecol_from_offset(context->stream,offset);
    colno = (uint32_t)pVar1.second;
    local_40.ref = context->stream;
    stream = &local_40;
    filename = ((local_40.ref)->stream_name)._M_dataplus._M_p;
    lineno = (uint32_t)pVar1.first;
  }
  format_error<int_const&>
            (__return_storage_ptr__,opt,type,stream,filename,lineno,colno,length,msg,args);
  return __return_storage_ptr__;
}

Assistant:

inline std::string format_error(const Options& opt, const char* type, const TokenStream::TokenInfo& context, const char* msg, Args&&... args)
{
    if(context.begin == context.end)
    {
        return format_error(opt, type, nullopt, context.stream.stream_name.c_str(), 0, 0, 0,
                            msg, std::forward<Args>(args)...);
    }
    else
    {
        size_t lineno, colno;
        size_t length = context.end - context.begin;
        std::tie(lineno, colno) = context.stream.linecol_from_offset(context.begin);
        return format_error(opt, type, context.stream, context.stream.stream_name.c_str(), lineno, colno, length,
                            msg, std::forward<Args>(args)...);
    }
}